

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqliteBuiltin_collection_create(jx9_context *pCtx,int argc,jx9_value **argv)

{
  unqlite_vm *pVm;
  jx9_user_func *pjVar1;
  jx9_value *pObj;
  int iVar2;
  char *pcVar3;
  unqlite_col *puVar4;
  int iFlag;
  jx9_vm *pVm_00;
  anon_union_8_3_18420de5_for_x aVar5;
  int nByte;
  SyString sName;
  sxu32 local_34;
  SyString local_30;
  
  if (argc < 1) {
    pjVar1 = pCtx->pFunc;
    pVm_00 = pCtx->pVm;
    pcVar3 = "Missing collection name";
LAB_00117eac:
    jx9VmThrowError(pVm_00,&pjVar1->sName,1,pcVar3);
  }
  else {
    pcVar3 = jx9_value_to_string(*argv,(int *)&local_34);
    if ((int)local_34 < 1) {
      pjVar1 = pCtx->pFunc;
      pVm_00 = pCtx->pVm;
      pcVar3 = "Invalid collection name";
      goto LAB_00117eac;
    }
    local_30.nByte = local_34;
    pVm = (unqlite_vm *)pCtx->pFunc->pUserData;
    local_30.zString = pcVar3;
    puVar4 = unqliteCollectionFetch(pVm,&local_30,iFlag);
    if (puVar4 == (unqlite_col *)0x0) {
      iVar2 = unqliteVmLoadCollection(pVm,pcVar3,local_34,1,(unqlite_col **)0x0);
      aVar5.iVal._1_7_ = 0;
      aVar5.iVal._0_1_ = iVar2 == 0;
      goto LAB_00117eb9;
    }
  }
  aVar5.rVal = 0.0;
LAB_00117eb9:
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  pObj->x = aVar5;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int unqliteBuiltin_collection_create(jx9_context *pCtx,int argc,jx9_value **argv)
{
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	int nByte;
	int rc;
	/* Extract collection name */
	if( argc < 1 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Try to create the collection */
	rc = unqliteCreateCollection(pVm,&sName);
	/* Return the result to the caller */
	jx9_result_bool(pCtx,rc == UNQLITE_OK ? 1 : 0);
	return JX9_OK;
}